

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cc
# Opt level: O0

void __thiscall
tchecker::local_array_statement_t::local_array_statement_t
          (local_array_statement_t *this,shared_ptr<const_tchecker::var_expression_t> *variable,
          shared_ptr<const_tchecker::expression_t> *size)

{
  element_type *peVar1;
  invalid_argument *piVar2;
  element_type *peVar3;
  shared_ptr<const_tchecker::expression_t> *size_local;
  shared_ptr<const_tchecker::var_expression_t> *variable_local;
  local_array_statement_t *this_local;
  
  statement_t::statement_t((statement_t *)this);
  *(undefined ***)this = &PTR__local_array_statement_t_004268b8;
  *(undefined ***)this = &PTR__local_array_statement_t_004268b8;
  std::shared_ptr<const_tchecker::var_expression_t>::shared_ptr(&this->_variable,variable);
  std::shared_ptr<const_tchecker::expression_t>::shared_ptr(&this->_size,size);
  peVar1 = std::__shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->_variable).
                       super___shared_ptr<const_tchecker::var_expression_t,_(__gnu_cxx::_Lock_policy)2>
                     );
  if (peVar1 == (element_type *)0x0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"nullptr local variable");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  peVar3 = std::__shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->_size).
                       super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>)
  ;
  if (peVar3 == (element_type *)0x0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar2,"nullptr size");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

local_array_statement_t::local_array_statement_t(std::shared_ptr<tchecker::var_expression_t const> const & variable,
                                                 std::shared_ptr<tchecker::expression_t const> const & size)
    : _variable(variable), _size(size)
{
  if (_variable.get() == nullptr)
    throw std::invalid_argument("nullptr local variable");
  if (_size.get() == nullptr)
    throw std::invalid_argument("nullptr size");
}